

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

t_pvalue __thiscall
xemmai::t_derived_primitive<double>::f_do_construct
          (t_derived_primitive<double> *this,t_pvalue *a_stack,size_t a_n)

{
  t_object *ptVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_pvalue tVar2;
  t_type local_30 [2];
  size_t a_n_local;
  t_pvalue *a_stack_local;
  t_derived_primitive<double> *this_local;
  
  a_n_local = a_n;
  a_stack_local = a_stack;
  this_local = this;
  ptVar1 = t_pointer::operator_cast_to_t_object_((t_pointer *)(a_n + 0x20));
  f_check<double>(ptVar1,L"argument0");
  local_30[0] = f_as<double,xemmai::t_value<xemmai::t_pointer>&>
                          ((t_value<xemmai::t_pointer> *)(a_n_local + 0x20));
  ptVar1 = t_type_of<xemmai::t_object>::f_new<double,double>
                     ((t_type_of<xemmai::t_object> *)a_stack,local_30);
  t_value<xemmai::t_pointer>::t_pointer((t_value<xemmai::t_pointer> *)this,ptVar1);
  tVar2.field_0.v_integer = extraout_RDX.v_integer;
  tVar2.super_t_pointer.v_p = (t_object *)this;
  return tVar2;
}

Assistant:

t_pvalue f_do_construct(t_pvalue* a_stack, size_t a_n)
	{
		f_check<T>(a_stack[2], L"argument0");
		return this->template f_new<T>(f_as<T>(a_stack[2]));
	}